

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_builder.h
# Opt level: O0

Instruction * __thiscall
spvtools::opt::InstructionBuilder::AddInstruction
          (InstructionBuilder *this,
          unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
          *insn)

{
  iterator_template<spvtools::opt::Instruction> local_28;
  Instruction *local_20;
  Instruction *insn_ptr;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  *insn_local;
  InstructionBuilder *this_local;
  
  insn_ptr = (Instruction *)insn;
  insn_local = (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                *)this;
  InstructionList::iterator::InsertBefore
            ((iterator *)&local_28,
             (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
              *)&this->insert_before_);
  local_20 = utils::IntrusiveList<spvtools::opt::Instruction>::
             iterator_template<spvtools::opt::Instruction>::operator*(&local_28);
  UpdateInstrToBlockMapping(this,local_20);
  UpdateDefUseMgr(this,local_20);
  return local_20;
}

Assistant:

Instruction* AddInstruction(std::unique_ptr<Instruction>&& insn) {
    Instruction* insn_ptr = &*insert_before_.InsertBefore(std::move(insn));
    UpdateInstrToBlockMapping(insn_ptr);
    UpdateDefUseMgr(insn_ptr);
    return insn_ptr;
  }